

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O2

ssize_t __thiscall MeshLib::Solid::write(Solid *this,int __fd,void *__buf,size_t __n)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  tEdge e;
  ostream *poVar3;
  double *pdVar4;
  tVertex pVVar5;
  Solid *pSVar6;
  ssize_t extraout_RAX;
  ssize_t sVar7;
  HalfEdge *pHVar8;
  ssize_t extraout_RAX_00;
  undefined4 in_register_00000034;
  Solid *pSVar9;
  int i;
  int i_00;
  HalfEdge *pHVar10;
  TreeIterator<MeshLib::Face> fiter;
  TreeIterator<MeshLib::Vertex> viter;
  TreeIterator<MeshLib::Edge> local_260;
  TreeIterator<MeshLib::Vertex> local_148;
  
  pSVar9 = (Solid *)CONCAT44(in_register_00000034,__fd);
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator(&local_148,&this->m_verts);
  while (local_148.m_finished == false) {
    pVVar1 = (local_148.m_pointer)->data;
    poVar3 = std::operator<<((ostream *)pSVar9,"Vertex ");
    std::ostream::operator<<(poVar3,pVVar1->m_id);
    for (i_00 = 0; i_00 != 3; i_00 = i_00 + 1) {
      std::operator<<((ostream *)pSVar9," ");
      pdVar4 = Point::operator[](&pVVar1->m_point,i_00);
      std::ostream::_M_insert<double>(*pdVar4);
    }
    if ((pVVar1->m_string)._M_string_length != 0) {
      poVar3 = std::operator<<((ostream *)pSVar9," {");
      poVar3 = std::operator<<(poVar3,(string *)&pVVar1->m_string);
      std::operator<<(poVar3,"}");
    }
    std::endl<char,std::char_traits<char>>((ostream *)pSVar9);
    AVL::TreeIterator<MeshLib::Vertex>::operator++(&local_148);
  }
  AVL::TreeIterator<MeshLib::Face>::TreeIterator
            ((TreeIterator<MeshLib::Face> *)&local_260,&this->m_faces);
  while (local_260.m_finished != true) {
    pEVar2 = (local_260.m_pointer)->data;
    poVar3 = std::operator<<((ostream *)pSVar9,"Face ");
    std::ostream::operator<<(poVar3,*(int *)pEVar2->m_halfedge);
    pHVar8 = pEVar2->m_halfedge[1];
    do {
      poVar3 = std::operator<<((ostream *)pSVar9," ");
      std::ostream::operator<<(poVar3,pHVar8->m_vertex->m_id);
      pHVar8 = pHVar8->m_next;
    } while (pHVar8 != pEVar2->m_halfedge[1]);
    if ((pEVar2->m_string)._M_dataplus._M_p != (pointer)0x0) {
      poVar3 = std::operator<<((ostream *)pSVar9," {");
      poVar3 = std::operator<<(poVar3,(string *)&pEVar2->key);
      std::operator<<(poVar3,"}");
    }
    std::endl<char,std::char_traits<char>>((ostream *)pSVar9);
    AVL::TreeIterator<MeshLib::Face>::operator++((TreeIterator<MeshLib::Face> *)&local_260);
  }
  AVL::TreeIterator<MeshLib::Edge>::TreeIterator(&local_260,&this->m_edges);
  while (local_260.m_finished != true) {
    e = (local_260.m_pointer)->data;
    if ((e->m_string)._M_string_length != 0) {
      pSVar6 = pSVar9;
      poVar3 = std::operator<<((ostream *)pSVar9,"Edge ");
      pVVar5 = edgeVertex1(pSVar6,e);
      pSVar6 = (Solid *)std::ostream::operator<<(poVar3,pVVar5->m_id);
      poVar3 = std::operator<<((ostream *)pSVar6," ");
      pVVar5 = edgeVertex2(pSVar6,e);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pVVar5->m_id);
      std::operator<<(poVar3," ");
      poVar3 = std::operator<<((ostream *)pSVar9,"{");
      poVar3 = std::operator<<(poVar3,(string *)&e->m_string);
      poVar3 = std::operator<<(poVar3,"}");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    AVL::TreeIterator<MeshLib::Edge>::operator++(&local_260);
  }
  AVL::TreeIterator<MeshLib::Face>::TreeIterator
            ((TreeIterator<MeshLib::Face> *)&local_260,&this->m_faces);
  sVar7 = extraout_RAX;
  while (local_260.m_finished != true) {
    pEVar2 = (local_260.m_pointer)->data;
    pHVar8 = pEVar2->m_halfedge[1];
    pHVar10 = pHVar8;
    do {
      if ((pHVar10->m_string)._M_string_length != 0) {
        poVar3 = std::operator<<((ostream *)pSVar9,"Corner ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar10->m_vertex->m_id);
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar10->m_face->m_id);
        std::operator<<(poVar3," ");
        poVar3 = std::operator<<((ostream *)pSVar9,"{");
        poVar3 = std::operator<<(poVar3,(string *)&pHVar10->m_string);
        poVar3 = std::operator<<(poVar3,"}");
        std::endl<char,std::char_traits<char>>(poVar3);
        pHVar8 = pEVar2->m_halfedge[1];
      }
      pHVar10 = pHVar10->m_next;
    } while (pHVar10 != pHVar8);
    AVL::TreeIterator<MeshLib::Face>::operator++((TreeIterator<MeshLib::Face> *)&local_260);
    sVar7 = extraout_RAX_00;
  }
  return sVar7;
}

Assistant:

void Solid::write( std::ostream & os ) {
	//remove vertices
	AVL::TreeIterator<Vertex> viter( m_verts );
	for( ; !viter.end() ; ++ viter ) {
		tVertex v = *viter;

		os << "Vertex " << v->id();
		
		for( int i = 0; i < 3; i ++ ) {
			os << " " << v->point()[i];  
		}

		if( v->string().size() > 0 ) {
			os << " {" << v->string() << "}";
		}

		os << std::endl;
	}

	for( AVL::TreeIterator<Face> fiter(m_faces); !fiter.end(); ++ fiter ) {
		tFace f = *fiter;
		os << "Face " << f->id();
		tHalfEdge he = f->halfedge();
		do {
			os << " " << he->target()->id();
			he = he->he_next();
		} while( he != f->halfedge() );

		if( f->string().size() > 0 ) {
			os << " {" << f->string() << "}";
		}

		os << std::endl;
	}


	for( AVL::TreeIterator<Edge> eiter(m_edges); !eiter.end(); ++ eiter ) {
		tEdge e = *eiter;
		if( e->string().size() > 0 ) {
			os << "Edge " << edgeVertex1(e)->id()<< " " << edgeVertex2(e)->id() << " ";
			os << "{" << e->string() << "}" << std::endl;
		}
	}

	for( AVL::TreeIterator<Face> pfiter(m_faces); !pfiter.end(); ++ pfiter ) {
		tFace f = *pfiter;
		tHalfEdge he = f->halfedge();
		do{
			if( he->string().size() > 0 )
			{
				os << "Corner " << he->vertex()->id() << " " << he->face()->id() << " ";
				os <<"{" << he->string() << "}" << std::endl;
			}
			he = he->he_next();
		}while( he != f->halfedge() );
	}


}